

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O3

int X509_NAME_add_entry(X509_NAME *name,X509_NAME_ENTRY *ne,int loc,int set)

{
  OPENSSL_STACK *sk;
  uint uVar1;
  size_t sVar2;
  void *pvVar3;
  X509_NAME_ENTRY *a;
  uint uVar4;
  int iVar5;
  size_t i;
  bool bVar6;
  
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  sk = (OPENSSL_STACK *)name->entries;
  sVar2 = OPENSSL_sk_num(sk);
  uVar1 = (uint)sVar2;
  uVar4 = loc;
  if ((int)uVar1 < loc) {
    uVar4 = uVar1;
  }
  if (loc < 0) {
    uVar4 = uVar1;
  }
  bVar6 = set == 0;
  name->modified = 1;
  if (set == -1) {
    if (uVar4 != 0) {
      pvVar3 = OPENSSL_sk_value(sk,(long)(int)(uVar4 - 1));
      iVar5 = *(int *)((long)pvVar3 + 0x10);
      bVar6 = false;
      goto LAB_004982e8;
    }
    bVar6 = true;
  }
  else {
    if ((int)uVar4 < (int)uVar1) {
      pvVar3 = OPENSSL_sk_value(sk,(long)(int)uVar4);
      iVar5 = *(int *)((long)pvVar3 + 0x10);
      goto LAB_004982e8;
    }
    if (uVar4 != 0) {
      pvVar3 = OPENSSL_sk_value(sk,(long)(int)(uVar4 - 1));
      iVar5 = *(int *)((long)pvVar3 + 0x10) + 1;
      goto LAB_004982e8;
    }
  }
  iVar5 = 0;
LAB_004982e8:
  a = X509_NAME_ENTRY_dup(ne);
  if (a != (X509_NAME_ENTRY *)0x0) {
    a->set = iVar5;
    sVar2 = OPENSSL_sk_insert(sk,a,(long)(int)uVar4);
    if (sVar2 != 0) {
      if (!bVar6) {
        return 1;
      }
      sVar2 = OPENSSL_sk_num(sk);
      if ((int)(uVar4 + 1) < (int)sVar2) {
        i = (size_t)(int)(uVar4 + 1);
        iVar5 = ~uVar4 + (int)sVar2;
        do {
          pvVar3 = OPENSSL_sk_value(sk,i);
          *(int *)((long)pvVar3 + 0x10) = *(int *)((long)pvVar3 + 0x10) + 1;
          i = i + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      return 1;
    }
    X509_NAME_ENTRY_free(a);
  }
  return 0;
}

Assistant:

int X509_NAME_add_entry(X509_NAME *name, const X509_NAME_ENTRY *entry, int loc,
                        int set) {
  X509_NAME_ENTRY *new_name = NULL;
  int i, inc;
  STACK_OF(X509_NAME_ENTRY) *sk;

  if (name == NULL) {
    return 0;
  }
  sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  if (loc > n) {
    loc = n;
  } else if (loc < 0) {
    loc = n;
  }

  inc = (set == 0);
  name->modified = 1;

  if (set == -1) {
    if (loc == 0) {
      set = 0;
      inc = 1;
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
    }
  } else {  // if (set >= 0)

    if (loc >= n) {
      if (loc != 0) {
        set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set + 1;
      } else {
        set = 0;
      }
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc)->set;
    }
  }

  if ((new_name = X509_NAME_ENTRY_dup(entry)) == NULL) {
    goto err;
  }
  new_name->set = set;
  if (!sk_X509_NAME_ENTRY_insert(sk, new_name, loc)) {
    goto err;
  }
  if (inc) {
    n = (int)sk_X509_NAME_ENTRY_num(sk);
    for (i = loc + 1; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set += 1;
    }
  }
  return 1;
err:
  if (new_name != NULL) {
    X509_NAME_ENTRY_free(new_name);
  }
  return 0;
}